

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn.c
# Opt level: O2

_Bool av1_cnn_predict_c(float **input,int in_width,int in_height,int in_stride,
                       CNN_CONFIG *cnn_config,CNN_THREAD_DATA *thread_data,
                       CNN_MULTI_OUT *output_struct)

{
  AVxWorker *pAVar1;
  uint branch;
  uint uVar2;
  int height;
  AVxWorker *pAVar3;
  float *gamma;
  CNN_THREAD_DATA *pCVar4;
  _Bool _Var5;
  bool bVar6;
  uint uVar7;
  AVxWorkerInterface *pAVar8;
  float **ppfVar9;
  float **ppfVar10;
  int *piVar11;
  long lVar12;
  int iVar13;
  TENSOR *pTVar14;
  int iVar15;
  int channels;
  TENSOR *pTVar16;
  CNN_LAYER_CONFIG *layer_config;
  long lVar17;
  int b;
  long lVar18;
  ulong uVar19;
  undefined1 *puVar20;
  long lVar21;
  ulong uVar22;
  int o_height;
  int o_width;
  CNN_LAYER_CONFIG *local_51f0;
  int local_51e8;
  int local_51e4;
  int local_51e0;
  int local_51dc;
  int local_51d8;
  int local_51d4;
  float **local_51d0;
  long local_51c8;
  float **local_51c0;
  float **local_51b8;
  CNN_THREAD_DATA *local_51b0;
  int local_51a4;
  int local_51a0;
  int local_519c;
  int *local_5198;
  CNN_CONFIG *local_5190;
  TENSOR *local_5188;
  long local_5180;
  float **local_5178;
  CNN_LAYER_CONFIG *local_5170;
  long local_5168;
  long local_5160;
  long local_5158;
  ulong local_5150;
  float **output [4];
  TENSOR tensor2 [4];
  long local_30c8;
  int local_30c0 [4];
  undefined8 local_30b0 [2];
  int local_30a0 [510];
  TENSOR tensor1 [4];
  TENSOR local_848;
  
  local_51e8 = in_width;
  local_51e4 = in_height;
  local_51a4 = in_stride;
  local_5190 = cnn_config;
  local_5178 = input;
  memset(tensor1,0,0x2060);
  memset(tensor2,0,0x2060);
  piVar11 = output_struct->output_channels;
  output[0] = output_struct->output_buffer;
  iVar15 = output_struct->num_outputs;
  ppfVar10 = output[0];
  for (lVar17 = 1; lVar17 < iVar15; lVar17 = lVar17 + 1) {
    ppfVar10 = ppfVar10 + piVar11[lVar17 + -1];
    output[lVar17] = ppfVar10;
  }
  o_width = 0;
  o_height = 0;
  for (lVar17 = 0; lVar17 != 0x2060; lVar17 = lVar17 + 0x818) {
    memset((void *)((long)tensor1[0].buf + lVar17 + -0x18),0,0x818);
    memset((void *)((long)tensor2[0].buf + lVar17 + -0x18),0,0x818);
  }
  local_5198 = output_struct->output_strides;
  local_5170 = local_5190->layer_config;
  lVar17 = 0;
  local_51d4 = local_51e4;
  local_51d8 = local_51e8;
  local_51b0 = thread_data;
  do {
    bVar6 = local_5190->num_layers <= lVar17;
    if (local_5190->num_layers <= lVar17) {
      bVar6 = true;
LAB_00344abc:
      for (lVar17 = 0; lVar17 != 0x2060; lVar17 = lVar17 + 0x818) {
        free_tensor((TENSOR *)((long)tensor1[0].buf + lVar17 + -0x18));
        free_tensor((TENSOR *)((long)tensor2[0].buf + lVar17 + -0x18));
      }
      return bVar6;
    }
    layer_config = local_5170 + lVar17;
    branch = local_5170[lVar17].branch;
    lVar18 = (long)(int)branch;
    lVar21 = lVar18 * 0x818;
    pTVar16 = tensor1 + lVar18;
    local_5160 = lVar17;
    if (lVar17 == 0) {
      assign_tensor(pTVar16,local_5178,layer_config->in_channels,local_51e8,local_51e4,local_51a4);
    }
    else {
      memcpy(&local_30c8,pTVar16,0x818);
      memcpy(pTVar16,tensor2 + lVar18,0x818);
      memcpy(tensor2 + lVar18,&local_30c8,0x818);
      local_51d8 = tensor1[lVar18].width;
      local_51d4 = tensor1[lVar18].height;
    }
    av1_find_cnn_layer_output_size(local_51d8,local_51d4,layer_config,&o_width,&o_height);
    lVar17 = (long)layer_config->output_num;
    pTVar14 = tensor2 + lVar18;
    if (lVar17 == -1) {
      local_51dc = o_width;
      local_51e0 = o_height;
      _Var5 = realloc_tensor(pTVar14,layer_config->out_channels,o_width,o_height);
      if (_Var5) goto LAB_00344562;
LAB_00344aac:
      bVar6 = false;
      goto LAB_00344abc;
    }
    free_tensor(pTVar14);
    local_51dc = o_width;
    local_51e0 = o_height;
    assign_tensor(pTVar14,output[lVar17],layer_config->out_channels,o_width,o_height,
                  local_5198[lVar17]);
LAB_00344562:
    if ((layer_config->branch_copy_type == '\x01') &&
       (_Var5 = copy_active_tensor_to_branches(pTVar16,layer_config,branch,tensor2), !_Var5))
    goto LAB_00344aac;
    pCVar4 = local_51b0;
    local_51f0 = layer_config;
    local_5168 = lVar17;
    if (layer_config->deconvolve == 0) {
      if (local_51b0->num_workers < 2) {
        av1_cnn_convolve(tensor1[lVar18].buf,tensor1[lVar18].width,tensor1[lVar18].height,
                         tensor1[lVar18].stride,layer_config,tensor2[lVar18].buf,
                         tensor2[lVar18].stride,0,1);
      }
      else {
        local_51d0 = (float **)CONCAT44(local_51d0._4_4_,tensor1[lVar18].height);
        local_51c8 = CONCAT44(local_51c8._4_4_,tensor1[lVar18].width);
        local_51c0 = tensor1[lVar18].buf;
        local_51b8 = tensor2[lVar18].buf;
        local_51a0 = tensor2[lVar18].stride;
        local_519c = tensor1[lVar18].stride;
        local_5188 = pTVar14;
        local_5180 = lVar21;
        pAVar8 = aom_get_worker_interface();
        uVar2 = pCVar4->num_workers;
        local_5150 = (ulong)uVar2;
        uVar7 = 0x20;
        if ((int)uVar2 < 0x20) {
          uVar7 = uVar2;
        }
        uVar22 = 0;
        uVar19 = (ulong)uVar7;
        if ((int)uVar7 < 1) {
          uVar19 = uVar22;
        }
        local_5158 = (ulong)(uVar2 - 1) * 0x38;
        for (lVar17 = 0; pTVar14 = local_5188, pCVar4 = local_51b0, uVar19 * 0x38 - lVar17 != 0;
            lVar17 = lVar17 + 0x38) {
          pAVar3 = local_51b0->workers;
          pAVar1 = (AVxWorker *)((long)&pAVar3->impl_ + lVar17);
          (*pAVar8->reset)(pAVar1);
          *(long *)((long)&local_30c8 + lVar17) = (long)local_51c0;
          *(undefined4 *)((long)local_30c0 + lVar17) = (undefined4)local_51c8;
          *(undefined4 *)((long)local_30c0 + lVar17 + 4) = local_51d0._0_4_;
          *(int *)((long)local_30c0 + lVar17 + 8) = local_519c;
          *(CNN_LAYER_CONFIG **)((long)local_30b0 + lVar17) = local_51f0;
          *(float ***)((long)local_30b0 + lVar17 + 8) = local_51b8;
          *(int *)((long)local_30a0 + lVar17) = local_51a0;
          *(int *)((long)local_30a0 + lVar17 + 4) = (int)uVar22;
          *(int *)((long)local_30a0 + lVar17 + 8) = (int)local_5150;
          *(code **)((long)&pAVar3->hook + lVar17) = convolve_layer;
          *(long **)((long)&pAVar3->data1 + lVar17) = (long *)((long)&local_30c8 + lVar17);
          *(undefined8 *)((long)&pAVar3->data2 + lVar17) = 0;
          (*(&pAVar8->launch)[local_5158 == lVar17])(pAVar1);
          uVar22 = (ulong)((int)uVar22 + 1);
        }
        for (lVar17 = 0; layer_config = local_51f0, lVar21 = local_5180, uVar19 * 0x38 - lVar17 != 0
            ; lVar17 = lVar17 + 0x38) {
          (*pAVar8->sync)((AVxWorker *)((long)&pCVar4->workers->impl_ + lVar17));
        }
      }
    }
    else {
      av1_cnn_deconvolve_c
                (tensor1[lVar18].buf,tensor1[lVar18].width,tensor1[lVar18].height,
                 tensor1[lVar18].stride,layer_config,tensor2[lVar18].buf,tensor2[lVar18].stride);
    }
    if ((layer_config->branch_copy_type == '\x02') &&
       (_Var5 = copy_active_tensor_to_branches(pTVar14,layer_config,branch,tensor2), !_Var5))
    goto LAB_00344abc;
    if (layer_config->branch_combine_type == '\x01') {
      ppfVar10 = tensor2[0].buf;
      for (uVar19 = 0; uVar19 != 4; uVar19 = uVar19 + 1) {
        if ((((uint)(layer_config->branch_config).branches_to_combine >> ((uint)uVar19 & 0x1f) & 1)
             != 0) && (branch != uVar19)) {
          av1_cnn_add_c((float **)((long)tensor2[0].buf + lVar21),pTVar14->channels,pTVar14->width,
                        pTVar14->height,pTVar14->stride,ppfVar10);
        }
        ppfVar10 = ppfVar10 + 0x103;
      }
    }
    pTVar16 = tensor2 + lVar18;
    av1_cnn_activate_c(tensor2[lVar18].buf,tensor2[lVar18].channels,tensor2[lVar18].width,
                       tensor2[lVar18].height,tensor2[lVar18].stride,layer_config->activation);
    gamma = (layer_config->bn_params).bn_gamma;
    if (gamma != (float *)0x0) {
      av1_cnn_batchnorm_c(tensor2[lVar18].buf,tensor2[lVar18].channels,tensor2[lVar18].width,
                          tensor2[lVar18].height,tensor2[lVar18].stride,gamma,
                          (layer_config->bn_params).bn_beta,(layer_config->bn_params).bn_mean,
                          (layer_config->bn_params).bn_std);
    }
    if (layer_config->branch_combine_type == '\x02') {
      if ((int)local_5168 == -1) {
        local_51b8 = (float **)(ulong)branch;
        ppfVar10 = tensor2[lVar18].buf + 1;
        local_51d0 = ppfVar10;
        for (puVar20 = (undefined1 *)0x0; puVar20 != &DAT_00000004; puVar20 = puVar20 + 1) {
          if ((((uint)(local_51f0->branch_config).branches_to_combine >> ((uint)puVar20 & 0x1f) & 1)
               != 0) && ((float **)puVar20 != local_51b8)) {
            iVar15 = tensor2[lVar18].channels;
            lVar21 = (long)tensor2[(long)puVar20].channels + (long)iVar15;
            iVar13 = tensor2[lVar18].width;
            height = tensor2[lVar18].height;
            channels = (int)lVar21;
            lVar17 = (long)puVar20 * 0x818;
            if (pTVar16->allocsize < iVar13 * height * channels) {
              local_51c8 = (long)puVar20 * 0x818;
              local_51c0 = (float **)(long)iVar15;
              memset(&local_848,0,0x818);
              _Var5 = realloc_tensor(&local_848,channels,iVar13,height);
              if (!_Var5) goto LAB_00344aac;
              copy_tensor(pTVar16,tensor2[lVar18].channels,0,&local_848);
              memcpy(&local_30c8,pTVar16,0x818);
              memcpy(pTVar16,&local_848,0x818);
              memcpy(&local_848,&local_30c8,0x818);
              free_tensor(&local_848);
              iVar15 = (int)local_51c0;
              lVar17 = local_51c8;
              ppfVar10 = local_51d0;
            }
            ppfVar9 = ppfVar10;
            for (lVar12 = 1; lVar12 < lVar21; lVar12 = lVar12 + 1) {
              *ppfVar9 = tensor2[lVar18].buf[0] +
                         (long)tensor2[lVar18].height *
                         (long)(int)lVar12 * (long)tensor2[lVar18].width;
              ppfVar9 = ppfVar9 + 1;
            }
            copy_tensor((TENSOR *)((long)tensor2[0].buf + lVar17 + -0x18),
                        *(int *)((long)tensor2[0].buf + lVar17 + -0x14),iVar15,pTVar16);
          }
        }
      }
      else {
        iVar15 = tensor2[lVar18].channels;
        piVar11 = &tensor2[0].channels;
        iVar13 = iVar15;
        for (uVar19 = 0; uVar19 != 4; uVar19 = uVar19 + 1) {
          if ((((uint)(local_51f0->branch_config).branches_to_combine >> ((uint)uVar19 & 0x1f) & 1)
               != 0) && (branch != uVar19)) {
            iVar13 = iVar13 + *piVar11;
          }
          piVar11 = piVar11 + 0x206;
        }
        assign_tensor(pTVar16,output[local_5168],iVar13,local_51dc,local_51e0,local_5198[local_5168]
                     );
        pTVar14 = tensor2;
        for (uVar19 = 0; uVar19 != 4; uVar19 = uVar19 + 1) {
          if ((((uint)(local_51f0->branch_config).branches_to_combine >> ((uint)uVar19 & 0x1f) & 1)
               != 0) && (branch != uVar19)) {
            copy_tensor(pTVar14,pTVar14->channels,iVar15,pTVar16);
            iVar15 = iVar15 + pTVar14->channels;
          }
          pTVar14 = pTVar14 + 1;
        }
      }
    }
    if ((local_51f0->branch_copy_type == '\x03') &&
       (_Var5 = copy_active_tensor_to_branches(pTVar16,local_51f0,branch,tensor2), !_Var5))
    goto LAB_00344abc;
    lVar17 = local_5160 + 1;
  } while( true );
}

Assistant:

bool av1_cnn_predict_c(const float **input, int in_width, int in_height,
                       int in_stride, const CNN_CONFIG *cnn_config,
                       const CNN_THREAD_DATA *thread_data,
                       CNN_MULTI_OUT *output_struct) {
  bool success = false;
  TENSOR tensor1[CNN_MAX_BRANCHES] = { { 0 } };
  TENSOR tensor2[CNN_MAX_BRANCHES] = { { 0 } };

  float **output[CNN_MAX_BRANCHES];
  const int *out_chs = output_struct->output_channels;
  output[0] = output_struct->output_buffer;
  for (int out_idx = 1; out_idx < output_struct->num_outputs; out_idx++) {
    output[out_idx] = output[out_idx - 1] + out_chs[out_idx - 1];
  }

  int i_width = in_width;
  int i_height = in_height;
  int o_width = 0, o_height = 0;
  for (int b = 0; b < CNN_MAX_BRANCHES; ++b) {
    init_tensor(&tensor1[b]);
    init_tensor(&tensor2[b]);
  }

  const int *out_stride = output_struct->output_strides;
  for (int layer = 0; layer < cnn_config->num_layers; ++layer) {
    const CNN_LAYER_CONFIG *layer_config = &cnn_config->layer_config[layer];
    const int branch = layer_config->branch;
    const CNN_BRANCH_CONFIG *branch_config = &layer_config->branch_config;

    // Allocate input tensor
    if (layer == 0) {       // First layer
      assert(branch == 0);  // First layer must be primary branch
      assign_tensor(&tensor1[branch], (float **)input,
                    layer_config->in_channels, in_width, in_height, in_stride);
    } else {  // Non-first layer
      // Swap tensor1 and tensor2
      swap_tensor(&tensor1[branch], &tensor2[branch]);

      i_width = tensor1[branch].width;
      i_height = tensor1[branch].height;
    }

    // Allocate output tensor
    av1_find_cnn_layer_output_size(i_width, i_height, layer_config, &o_width,
                                   &o_height);
    const int output_num = layer_config->output_num;
    if (output_num == -1) {  // Non-output layer
      if (!realloc_tensor(&tensor2[branch], layer_config->out_channels, o_width,
                          o_height)) {
        goto Error;
      }
    } else {  // Output layer
      free_tensor(&tensor2[branch]);
      assign_tensor(&tensor2[branch], output[output_num],
                    layer_config->out_channels, o_width, o_height,
                    out_stride[output_num]);
    }

    // If we are combining branches make sure that the branch to combine
    // is different from the current branch.
    assert(IMPLIES(layer_config->branch_combine_type != BRANCH_NOC,
                   !(branch_config->branches_to_combine & (1 << branch))));

    if (layer_config->branch_copy_type == BRANCH_INPUT) {
      if (!copy_active_tensor_to_branches(&tensor1[branch], layer_config,
                                          branch, tensor2)) {
        goto Error;
      }
    }
    // Check consistency of input and output channels
    assert(tensor1[branch].channels == layer_config->in_channels);
    assert(tensor2[branch].channels == layer_config->out_channels);

    // Convolve/Deconvolve
    if (!cnn_config->layer_config[layer].deconvolve) {
      if (thread_data->num_workers > 1) {
        convolve_layer_mt((const float **)tensor1[branch].buf,
                          tensor1[branch].width, tensor1[branch].height,
                          tensor1[branch].stride, layer_config, thread_data,
                          tensor2[branch].buf, tensor2[branch].stride);
      } else {
        av1_cnn_convolve((const float **)tensor1[branch].buf,
                         tensor1[branch].width, tensor1[branch].height,
                         tensor1[branch].stride, layer_config,
                         tensor2[branch].buf, tensor2[branch].stride, 0, 1);
      }
    } else {
      av1_cnn_deconvolve((const float **)tensor1[branch].buf,
                         tensor1[branch].width, tensor1[branch].height,
                         tensor1[branch].stride, layer_config,
                         tensor2[branch].buf, tensor2[branch].stride);
    }

    if (layer_config->branch_copy_type == BRANCH_OUTPUT) {
      if (!copy_active_tensor_to_branches(&tensor2[branch], layer_config,
                                          branch, tensor2)) {
        goto Error;
      }
    }

    // Add tensors from other branches if needed
    if (layer_config->branch_combine_type == BRANCH_ADD) {
      for (int b = 0; b < CNN_MAX_BRANCHES; ++b) {
        if ((branch_config->branches_to_combine & (1 << b)) && b != branch) {
          assert(check_tensor_equal_size(&tensor2[b], &tensor2[branch]));
          av1_cnn_add(tensor2[branch].buf, tensor2[branch].channels,
                      tensor2[branch].width, tensor2[branch].height,
                      tensor2[branch].stride, (const float **)tensor2[b].buf);
        }
      }
    }

    // Non-linearity
    av1_cnn_activate(tensor2[branch].buf, tensor2[branch].channels,
                     tensor2[branch].width, tensor2[branch].height,
                     tensor2[branch].stride, layer_config->activation);

    if (layer_config->bn_params.bn_gamma) {
      av1_cnn_batchnorm(
          tensor2[branch].buf, tensor2[branch].channels, tensor2[branch].width,
          tensor2[branch].height, tensor2[branch].stride,
          layer_config->bn_params.bn_gamma, layer_config->bn_params.bn_beta,
          layer_config->bn_params.bn_mean, layer_config->bn_params.bn_std);
    }

    // Concatenate tensors
    if (layer_config->branch_combine_type == BRANCH_CAT) {
      if (output_num == -1) {  // Non-output layer
        for (int b = 0; b < CNN_MAX_BRANCHES; ++b) {
          if ((branch_config->branches_to_combine & (1 << b)) && b != branch) {
            assert(check_tensor_equal_dims(&tensor2[b], &tensor2[branch]));
            assert(tensor2[b].channels > 0);
            if (!concat_tensor(&tensor2[b], &tensor2[branch])) goto Error;
          }
        }
      } else {  // Output layer
        const int existing_channels = tensor2[branch].channels;
        int num_chs = existing_channels;
        for (int b = 0; b < CNN_MAX_BRANCHES; ++b) {
          if ((branch_config->branches_to_combine & (1 << b)) && b != branch) {
            assert(check_tensor_equal_dims(&tensor2[b], &tensor2[branch]));
            // Needed only to assign the new channel buffers
            num_chs += tensor2[b].channels;
          }
        }
        assign_tensor(&tensor2[branch], output[output_num], num_chs, o_width,
                      o_height, out_stride[output_num]);

        num_chs = existing_channels;
        for (int b = 0; b < CNN_MAX_BRANCHES; ++b) {
          if ((branch_config->branches_to_combine & (1 << b)) && b != branch) {
            assert(check_tensor_equal_dims(&tensor2[b], &tensor2[branch]));
            // Needed only to assign the new channel buffers
            copy_tensor(&tensor2[b], tensor2[b].channels, num_chs,
                        &tensor2[branch]);
            num_chs += tensor2[b].channels;
          }
        }
      }
    }

    if (layer_config->branch_copy_type == BRANCH_COMBINED) {
      if (!copy_active_tensor_to_branches(&tensor2[branch], layer_config,
                                          branch, tensor2)) {
        goto Error;
      }
    }
  }

  success = true;
Error:
  for (int b = 0; b < CNN_MAX_BRANCHES; ++b) {
    free_tensor(&tensor1[b]);
    free_tensor(&tensor2[b]);
  }
  return success;
}